

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O0

void __thiscall
wabt::OpcodeInfo::WriteArray<unsigned_int,wabt::OpcodeInfo::Write(wabt::Stream&)::__1>
          (OpcodeInfo *this,Stream *stream,anon_class_8_1_6bf940be *write_func)

{
  char *pcVar1;
  pair<const_unsigned_int_*,_unsigned_long> pVar2;
  uint *local_38;
  size_t i;
  pair<const_unsigned_int_*,_unsigned_long> pair;
  anon_class_8_1_6bf940be *write_func_local;
  Stream *stream_local;
  OpcodeInfo *this_local;
  
  pVar2 = GetDataArray<unsigned_int>(this);
  for (local_38 = (uint *)0x0; pair.first = (uint *)pVar2.second, local_38 < pair.first;
      local_38 = (uint *)((long)local_38 + 1)) {
    pcVar1 = ", ";
    if (local_38 == (uint *)0x0) {
      pcVar1 = " ";
    }
    Stream::Writef(stream,"%s",pcVar1);
    i = (size_t)pVar2.first;
    Write::anon_class_8_1_6bf940be::operator()(write_func,*(Index *)(i + (long)local_38 * 4));
  }
  return;
}

Assistant:

void OpcodeInfo::WriteArray(Stream& stream, F&& write_func) {
  auto pair = GetDataArray<T>();
  for (size_t i = 0; i < pair.second; ++i) {
    // Write an initial space (to separate from the opcode name) first, then
    // comma-separate.
    stream.Writef("%s", i == 0 ? " " : ", ");
    write_func(pair.first[i]);
  }
}